

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void google::protobuf::compiler::ruby::GenerateEnum(EnumDescriptor *en,Printer *printer)

{
  string *value1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  string local_50;
  
  io::Printer::Print(printer,"add_enum \"$name$\" do\n","name",*(string **)(en + 8));
  io::Printer::Indent(printer);
  if (0 < *(int *)(en + 0x2c)) {
    lVar3 = 0x10;
    lVar2 = 0;
    uVar1 = extraout_RDX;
    do {
      value1 = *(string **)(*(long *)(en + 0x30) + -0x10 + lVar3);
      IntToString_abi_cxx11_
                (&local_50,(ruby *)(ulong)*(uint *)(*(long *)(en + 0x30) + lVar3),(int32)uVar1);
      io::Printer::Print(printer,"value :$name$, $number$\n","name",value1,"number",&local_50);
      uVar1 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar1 = extraout_RDX_01;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar2 < *(int *)(en + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n");
  return;
}

Assistant:

void GenerateEnum(const google::protobuf::EnumDescriptor* en,
                  google::protobuf::io::Printer* printer) {
  printer->Print(
    "add_enum \"$name$\" do\n",
    "name", en->full_name());
  printer->Indent();

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
      "value :$name$, $number$\n",
      "name", value->name(),
      "number", IntToString(value->number()));
  }

  printer->Outdent();
  printer->Print(
    "end\n");
}